

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZX8081.cpp
# Opt level: O2

void __thiscall
Sinclair::ZX8081::ConcreteMachine<false>::ConcreteMachine
          (ConcreteMachine<false> *this,Target *target,ROMFetcher *rom_fetcher)

{
  MemoryModel MVar1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  bool bVar2;
  iterator iVar3;
  undefined4 *puVar4;
  undefined4 uVar5;
  Name rom_name;
  TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper> *local_c8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_c0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_b8;
  Parser *local_b0;
  HalfClockReceiver<Storage::Tape::BinaryTapePlayer> *local_a8;
  Processor<Sinclair::ZX8081::ConcreteMachine<false>,_false,_false> *local_a0;
  MappedKeyboardMachine *local_98;
  Keyboard *local_90;
  map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  roms;
  Request request;
  
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0057d638;
  (this->super_TimedMachine).clock_rate_ = 1.0;
  (this->super_TimedMachine).clock_conversion_error_ = 0.0;
  (this->super_TimedMachine).speed_multiplier_ = 1.0;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR___cxa_pure_virtual_0057d600;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&PTR___cxa_pure_virtual_0057cd58;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&PTR___cxa_pure_virtual_0057d680;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &roms._M_t._M_impl.super__Rb_tree_header._M_header;
  roms._M_t._M_impl._0_8_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  roms._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  roms._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       roms._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  MachineTypes::MappedKeyboardMachine::MappedKeyboardMachine
            (&this->super_MappedKeyboardMachine,
             (set<Inputs::Keyboard::Key,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
              *)&roms);
  std::
  _Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
  ::~_Rb_tree((_Rb_tree<Inputs::Keyboard::Key,_Inputs::Keyboard::Key,_std::_Identity<Inputs::Keyboard::Key>,_std::less<Inputs::Keyboard::Key>,_std::allocator<Inputs::Keyboard::Key>_>
               *)&roms);
  (this->super_Device)._vptr_Device = (_func_int **)&PTR___cxa_pure_virtual_00584df0;
  local_c8 = &this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>;
  roms._M_t._M_impl._0_8_ = roms._M_t._M_impl._0_8_ & 0xffffffff00000000;
  local_98 = &this->super_MappedKeyboardMachine;
  Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::
  TypeRecipient<Sinclair::ZX::Keyboard::Machine>(local_c8,(Machine *)&roms);
  (this->super_TimedMachine)._vptr_TimedMachine = (_func_int **)&PTR_run_for_0058b100;
  (this->super_ScanProducer)._vptr_ScanProducer = (_func_int **)&PTR_set_scan_target_0058b1d0;
  (this->super_AudioProducer)._vptr_AudioProducer = (_func_int **)&DAT_0058b208;
  (this->super_MediaTarget)._vptr_MediaTarget = (_func_int **)&DAT_0058b220;
  (this->super_MappedKeyboardMachine).super_Delegate._vptr_Delegate =
       (_func_int **)&PTR_keyboard_did_change_key_0058b238;
  (this->super_MappedKeyboardMachine).super_KeyboardMachine.super_KeyActions._vptr_KeyActions =
       (_func_int **)&PTR_set_key_state_0058b268;
  (this->super_Device)._vptr_Device = (_func_int **)&PTR_set_options_0058b2a8;
  (this->super_TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>).super_Delegate.
  super_KeyActions._vptr_KeyActions = (_func_int **)&PTR_set_key_state_0058b2c8;
  (this->super_Machine)._vptr_Machine = (_func_int **)&PTR__ConcreteMachine_0058b308;
  CPU::Z80::Processor<Sinclair::ZX8081::ConcreteMachine<false>,_false,_false>::Processor
            (&this->z80_,this);
  local_a0 = &this->z80_;
  ZX8081::Video::Video(&this->video_);
  this->should_autorun_ = false;
  local_b8 = &this->ram_;
  (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ram_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0 = &this->rom_;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  this->vsync_ = false;
  this->hsync_ = false;
  this->line_counter_ = 0;
  local_90 = &this->keyboard_;
  ZX::Keyboard::Keyboard::Keyboard(local_90,ZX80);
  ZX::Keyboard::KeyboardMapper::KeyboardMapper(&this->keyboard_mapper_,ZX80);
  HalfClockReceiver<Storage::Tape::BinaryTapePlayer>::BinaryTapePlayer(&this->tape_player_,0x319750)
  ;
  local_b0 = &this->parser_;
  local_a8 = &this->tape_player_;
  Storage::Tape::ZX8081::Parser::Parser(local_b0);
  this->nmi_is_enabled_ = false;
  (this->horizontal_counter_).super_WrappedInt<HalfCycles>.length_ = 0;
  this->latched_video_byte_ = '\0';
  this->has_latched_video_byte_ = false;
  this->use_fast_tape_hack_ = false;
  this->allow_fast_tape_hack_ = false;
  this->use_automatic_tape_motor_control_ = true;
  (this->tape_advance_delay_).super_WrappedInt<HalfCycles>.length_ = 0;
  Concurrency::AsyncTaskQueue<false,_true,_void>::AsyncTaskQueue<>(&this->audio_queue_);
  GI::AY38910::AY38910<false>::AY38910SampleSource(&this->ay_,AY38910,&this->audio_queue_);
  Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>::PullLowpass
            (&this->speaker_,&this->ay_);
  (this->time_since_ay_update_).super_WrappedInt<HalfCycles>.length_ = 0;
  (this->super_TimedMachine).clock_rate_ = 3250000.0;
  Outputs::Speaker::LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
  ::set_input_rate(&(this->speaker_).
                    super_LowpassBase<Outputs::Speaker::PullLowpass<GI::AY38910::AY38910<false>_>,_false>
                   ,1.625e+06);
  this_00 = local_b8;
  rom_name = (byte)(target->ZX80_uses_ZX81_ROM | target->is_ZX81) & AcornBASICII | ZX80;
  ROM::Request::Request(&request,rom_name,false);
  std::
  function<std::map<ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>_(const_ROM::Request_&)>
  ::operator()(&roms,rom_fetcher,&request);
  bVar2 = ROM::Request::validate(&request,&roms);
  if (!bVar2) {
    puVar4 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar4 = 0;
    __cxa_throw(puVar4,&ROMMachine::Error::typeinfo,0);
  }
  iVar3 = std::
          _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
          ::find(&roms._M_t,&rom_name);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (local_c0,&iVar3._M_node[1]._M_parent);
  this->rom_mask_ =
       ~(ushort)*(undefined4 *)
                 &(this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start +
       (short)*(undefined4 *)
               &(this->rom_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish;
  MVar1 = target->memory_model;
  if (MVar1 == Unexpanded) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x400);
    uVar5 = 0x400003ff;
  }
  else if (MVar1 == SixteenKB) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x4000);
    uVar5 = 0x40003fff;
  }
  else {
    if (MVar1 != SixtyFourKB) goto LAB_00351610;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this_00,0x10000);
    uVar5 = 0x2000ffff;
  }
  this->ram_mask_ = (short)uVar5;
  this->ram_base_ = (short)((uint)uVar5 >> 0x10);
LAB_00351610:
  Memory::Fuzz<std::vector<unsigned_char,std::allocator<unsigned_char>>>(this_00);
  ZX::Keyboard::Keyboard::clear_all_keys(local_90);
  if ((target->loading_command)._M_string_length != 0) {
    Utility::TypeRecipient<Sinclair::ZX::Keyboard::CharacterMapper>::add_typer
              (local_c8,&target->loading_command);
    this->should_autorun_ = true;
  }
  insert_media(this,&(target->super_Target).media);
  std::
  _Rb_tree<ROM::Name,_std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<ROM::Name>,_std::allocator<std::pair<const_ROM::Name,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
  ::~_Rb_tree(&roms._M_t);
  std::vector<ROM::Request::Node,_std::allocator<ROM::Request::Node>_>::~vector
            (&request.node.children);
  return;
}

Assistant:

ConcreteMachine(const Analyser::Static::ZX8081::Target &target, const ROMMachine::ROMFetcher &rom_fetcher) :
			Utility::TypeRecipient<CharacterMapper>(keyboard_machine()),
			z80_(*this),
			keyboard_(keyboard_machine()),
			keyboard_mapper_(keyboard_machine()),
			tape_player_(ZX8081ClockRate),
			ay_(GI::AY38910::Personality::AY38910, audio_queue_),
			speaker_(ay_) {
			set_clock_rate(ZX8081ClockRate);
			speaker_.set_input_rate(float(ZX8081ClockRate) / 2.0f);

			const bool use_zx81_rom = target.is_ZX81 || target.ZX80_uses_ZX81_ROM;
			const ROM::Name rom_name = use_zx81_rom ? ROM::Name::ZX81 : ROM::Name::ZX80;
			const ROM::Request request(rom_name);
			auto roms = rom_fetcher(request);
			if(!request.validate(roms)) {
				throw ROMMachine::Error::MissingROMs;
			}
			rom_ = std::move(roms.find(rom_name)->second);

			rom_mask_ = uint16_t(rom_.size() - 1);

			switch(target.memory_model) {
				case Analyser::Static::ZX8081::Target::MemoryModel::Unexpanded:
					ram_.resize(1024);
					ram_base_ = 16384;
					ram_mask_ = 1023;
				break;
				case Analyser::Static::ZX8081::Target::MemoryModel::SixteenKB:
					ram_.resize(16384);
					ram_base_ = 16384;
					ram_mask_ = 16383;
				break;
				case Analyser::Static::ZX8081::Target::MemoryModel::SixtyFourKB:
					ram_.resize(65536);
					ram_base_ = 8192;
					ram_mask_ = 65535;
				break;
			}
			Memory::Fuzz(ram_);

			// Ensure valid initial key state.
			clear_all_keys();
			if(!target.loading_command.empty()) {
				type_string(target.loading_command);
				should_autorun_ = true;
			}

			insert_media(target.media);
		}